

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::expand(Path *__return_storage_ptr__,Path *this)

{
  char *pcVar1;
  long lVar2;
  string local_108 [32];
  Path local_e8;
  undefined1 local_c8 [8];
  Path homepath;
  string str;
  Path local_88;
  Path local_68;
  undefined1 local_38 [8];
  Path path;
  Path *this_local;
  
  path._24_8_ = this;
  Path((Path *)local_38,this);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this);
  if (*pcVar1 != '~') {
    pwd();
    absolute(&local_68,(Path *)local_38,&local_88);
    operator=((Path *)local_38,&local_68);
    ~Path(&local_68);
    ~Path(&local_88);
  }
  str_abi_cxx11_((Path *)&homepath.field_0x18);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&homepath.field_0x18);
  if (*pcVar1 != '~') goto LAB_0010e1ac;
  home();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&homepath.field_0x18);
  if (*pcVar1 == '/') {
LAB_0010e0b8:
    std::__cxx11::string::replace((ulong)&homepath.field_0x18,0,(string *)0x1);
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 1) goto LAB_0010e0b8;
  }
  std::__cxx11::string::string(local_108,(string *)&homepath.field_0x18);
  Path(&local_e8,(string *)local_108);
  operator=((Path *)local_38,&local_e8);
  ~Path(&local_e8);
  std::__cxx11::string::~string(local_108);
  ~Path((Path *)local_c8);
LAB_0010e1ac:
  prune(__return_storage_ptr__,(Path *)local_38);
  std::__cxx11::string::~string((string *)&homepath.field_0x18);
  ~Path((Path *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Path Path::expand() const
{
  Path path(*this); // copy

  if (m_path[0] != '~')
    path = path.absolute();

  std::string str = path.str();
  if (str[0] == '~') {
    Path homepath = home();

    if (str[1] == '/' || str.length() == 1) {
      // User home requested
      str.replace(0, 1, homepath.m_path);
    }

    path = Path(str);
  }

  return path.prune();
}